

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_> __thiscall
pegmatite::parse(pegmatite *this,Input *input,Rule *g,Rule *ws,ErrorReporter *err,ParserDelegate *d)

{
  ASTNode *pAVar1;
  char *pcVar2;
  pointer ppVar3;
  bool bVar4;
  ulong uVar5;
  pointer ppVar6;
  pegmatite *ppVar7;
  ASTStack st;
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = parse(input,g,ws,err,d,&local_48);
  ppVar3 = local_48.
           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = this;
  if (bVar4) {
    if (1 < (ulong)(((long)local_48.
                           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_48.
                           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7) &&
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar5 = 0;
      ppVar6 = local_48.
               super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        pAVar1 = (ppVar6->second)._M_t.
                 super___uniq_ptr_impl<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pegmatite::ASTNode_*,_std::default_delete<pegmatite::ASTNode>_>
                 .super__Head_base<0UL,_pegmatite::ASTNode_*,_false>._M_head_impl;
        if (pAVar1 == (ASTNode *)0x0) {
          __cxa_bad_typeid();
          goto LAB_00128070;
        }
        pcVar2 = *(char **)(pAVar1->_vptr_ASTNode[-1] + 8);
        fprintf(_stderr,"[%d] %s\n",uVar5,pcVar2 + (*pcVar2 == '*'));
        ppVar6 = ppVar6 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (ppVar6 != ppVar3);
    }
    if ((long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_48.
              super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x38) {
LAB_00128070:
      __assert_fail("st.size() == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/plietar[P]Pegmatite/ast.cc"
                    ,0xaa,
                    "std::unique_ptr<ASTNode> pegmatite::parse(Input &, const Rule &, const Rule &, ErrorReporter &, const ParserDelegate &)"
                   );
    }
    ppVar7 = (pegmatite *)
             &(local_48.
               super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second;
    *(ASTNode **)this =
         ((local_48.
           super__Vector_base<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->second)._M_t.
         super___uniq_ptr_impl<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>._M_t.
         super__Tuple_impl<0UL,_pegmatite::ASTNode_*,_std::default_delete<pegmatite::ASTNode>_>.
         super__Head_base<0UL,_pegmatite::ASTNode_*,_false>._M_head_impl;
  }
  *(undefined8 *)ppVar7 = 0;
  std::
  vector<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>,_std::allocator<std::pair<const_pegmatite::InputRange,_std::unique_ptr<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>_>_>_>_>
  ::~vector(&local_48);
  return (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         (__uniq_ptr_data<pegmatite::ASTNode,_std::default_delete<pegmatite::ASTNode>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<ASTNode> parse(Input &input, const Rule &g, const Rule &ws,
                               ErrorReporter &err, const ParserDelegate &d)
{
	ASTStack st;
	if (!parse(input, g, ws, err, d, &st)) return nullptr;
	if (st.size() > 1)
	{
		int i = 0;
		for (auto &I : st)
		{
			auto *val = I.second.get();
			fprintf(stderr, "[%d] %s\n", i++, typeid(*val).name());
		}
	}
	assert(st.size() == 1);
	return std::move(st[0].second);
}